

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase *
MatchArgumentType(ExpressionContext *ctx,SynBase *source,TypeBase *expectedType,TypeBase *actualType
                 ,ExprBase *actualValue,IntrusiveList<MatchData> *aliases)

{
  TypeBase *pTVar1;
  FunctionValue bestOverload;
  FunctionValue FStack_48;
  
  if (actualType->isGeneric == true) {
    if ((expectedType != (TypeBase *)0x0) && (expectedType->typeID == 0x15)) {
      GetFunctionForType(&FStack_48,ctx,source,actualValue,(TypeFunction *)expectedType);
      if (FStack_48.function != (FunctionData *)0x0) {
        actualType = &(FStack_48.function)->type->super_TypeBase;
      }
      if (((((TypeFunction *)actualType)->super_TypeBase).isGeneric & 1U) == 0) goto LAB_00170524;
    }
    return (TypeBase *)0x0;
  }
LAB_00170524:
  pTVar1 = MatchGenericType(ctx,source,expectedType,actualType,aliases,
                            actualValue == (ExprBase *)0x0);
  return pTVar1;
}

Assistant:

TypeBase* MatchArgumentType(ExpressionContext &ctx, SynBase *source, TypeBase *expectedType, TypeBase *actualType, ExprBase *actualValue, IntrusiveList<MatchData> &aliases)
{
	if(actualType->isGeneric)
	{
		if(TypeFunction *target = getType<TypeFunction>(expectedType))
		{
			if(FunctionValue bestOverload = GetFunctionForType(ctx, source, actualValue, target))
				actualType = bestOverload.function->type;
		}

		if(actualType->isGeneric)
			return NULL;
	}

	return MatchGenericType(ctx, source, expectedType, actualType, aliases, !actualValue);
}